

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O2

void testing::internal::PrintCharAndCodeTo<unsigned_char>(uchar c,ostream *os)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  ostream *poVar5;
  uint32_t value;
  int iVar6;
  char *pcVar7;
  undefined7 in_register_00000039;
  ulong uVar8;
  string local_40;
  
  uVar8 = CONCAT71(in_register_00000039,c);
  poVar5 = std::operator<<(os,"");
  std::operator<<(poVar5,"\'");
  iVar6 = (int)uVar8;
  switch(uVar8 & 0xffffffff) {
  case 0:
    pcVar7 = "\\0";
    break;
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
switchD_00137997_caseD_1:
    if (0x5e < iVar6 - 0x20U) {
      uVar1 = *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18);
      poVar5 = std::operator<<(os,"\\x");
      lVar2 = *(long *)poVar5;
      lVar3 = *(long *)(lVar2 + -0x18);
      *(uint *)(poVar5 + lVar3 + 0x18) = *(uint *)(poVar5 + lVar3 + 0x18) & 0xffffffb5 | 8;
      *(uint *)(poVar5 + *(long *)(lVar2 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(lVar2 + -0x18) + 0x18) | 0x4000;
      std::ostream::operator<<(poVar5,iVar6);
      *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18) = uVar1;
      bVar4 = true;
      goto LAB_00137a22;
    }
    std::operator<<(os,c);
    goto LAB_00137a1f;
  case 7:
    pcVar7 = "\\a";
    break;
  case 8:
    pcVar7 = "\\b";
    break;
  case 9:
    pcVar7 = "\\t";
    break;
  case 10:
    pcVar7 = "\\n";
    break;
  case 0xb:
    pcVar7 = "\\v";
    break;
  case 0xc:
    pcVar7 = "\\f";
    break;
  case 0xd:
    pcVar7 = "\\r";
    break;
  default:
    if (iVar6 == 0x27) {
      pcVar7 = "\\\'";
    }
    else {
      if (iVar6 != 0x5c) goto switchD_00137997_caseD_1;
      pcVar7 = "\\\\";
    }
  }
  std::operator<<(os,pcVar7);
LAB_00137a1f:
  bVar4 = false;
LAB_00137a22:
  std::operator<<(os,"\'");
  if (c != '\0') {
    poVar5 = std::operator<<(os," (");
    std::ostream::operator<<(poVar5,iVar6);
    if (9 < c && !bVar4) {
      poVar5 = std::operator<<(os,", 0x");
      String::FormatHexUInt32_abi_cxx11_(&local_40,(String *)(uVar8 & 0xffffffff),value);
      std::operator<<(poVar5,(string *)&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
    std::operator<<(os,")");
  }
  return;
}

Assistant:

void PrintCharAndCodeTo(Char c, ostream* os) {
  // First, print c as a literal in the most readable form we can find.
  *os << GetCharWidthPrefix(c) << "'";
  const CharFormat format = PrintAsCharLiteralTo(c, os);
  *os << "'";

  // To aid user debugging, we also print c's code in decimal, unless
  // it's 0 (in which case c was printed as '\\0', making the code
  // obvious).
  if (c == 0) return;
  *os << " (" << static_cast<int>(c);

  // For more convenience, we print c's code again in hexadecimal,
  // unless c was already printed in the form '\x##' or the code is in
  // [1, 9].
  if (format == kHexEscape || (1 <= c && c <= 9)) {
    // Do nothing.
  } else {
    *os << ", 0x" << String::FormatHexInt(static_cast<int>(c));
  }
  *os << ")";
}